

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_flushStream(ZSTD_CStream *zcs,ZSTD_outBuffer *output)

{
  size_t sVar1;
  ZSTD_inBuffer *pZVar2;
  ZSTD_inBuffer input;
  ZSTD_inBuffer nullInput;
  ZSTD_inBuffer local_38;
  ZSTD_inBuffer local_18;
  
  local_18.src = (void *)0x0;
  local_18.size = 0;
  local_18.pos = 0;
  pZVar2 = &zcs->expectedInBuffer;
  if ((zcs->appliedParams).inBufferMode != ZSTD_bm_stable) {
    pZVar2 = &local_18;
  }
  local_38.size = pZVar2->pos;
  local_38.src = pZVar2->src;
  local_38.pos = local_38.size;
  sVar1 = ZSTD_compressStream2(zcs,output,&local_38,ZSTD_e_flush);
  return sVar1;
}

Assistant:

size_t ZSTD_flushStream(ZSTD_CStream* zcs, ZSTD_outBuffer* output)
{
    ZSTD_inBuffer input = inBuffer_forEndFlush(zcs);
    input.size = input.pos; /* do not ingest more input during flush */
    return ZSTD_compressStream2(zcs, output, &input, ZSTD_e_flush);
}